

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-future.c
# Opt level: O2

int test(green_loop_t loop)

{
  int iVar1;
  green_future_t pgVar2;
  char *pcVar3;
  undefined8 uStack_30;
  int local_24;
  void *p;
  
  pgVar2 = green_future_init((green_loop_t)0x0);
  if (pgVar2 == (green_future_t)0x0) {
    pgVar2 = green_future_init(loop);
    if (pgVar2 == (green_future_t)0x0) {
      pcVar3 = "(f) != (((void*)0))";
      uStack_30 = 0x11;
    }
    else {
      p = (void *)0x0;
      local_24 = 0;
      iVar1 = green_future_result((green_future_t)0x0,&p,&local_24);
      if (iVar1 == 1) {
        if (p == (void *)0x0) {
          if (local_24 == 0) {
            iVar1 = green_future_set_result((green_future_t)0x0,(void *)0x0,0);
            if (iVar1 == 1) {
              iVar1 = green_future_acquire((green_future_t)0x0);
              if (iVar1 == 1) {
                iVar1 = green_future_release((green_future_t)0x0);
                if (iVar1 == 1) {
                  iVar1 = green_future_result(pgVar2,&p,&local_24);
                  if (iVar1 == 3) {
                    iVar1 = green_future_done((green_future_t)0x0);
                    if (iVar1 == 0) {
                      pcVar3 = "(green_future_done(((void*)0))) != (0)";
                      uStack_30 = 0x26;
                    }
                    else {
                      iVar1 = green_future_done(pgVar2);
                      if (iVar1 == 0) {
                        iVar1 = green_future_set_result(pgVar2,&local_24,7);
                        if (iVar1 == 0) {
                          iVar1 = green_future_result(pgVar2,&p,&local_24);
                          if (iVar1 == 0) {
                            if ((int *)p == &local_24) {
                              if (local_24 == 7) {
                                iVar1 = green_future_done(pgVar2);
                                if (iVar1 == 0) {
                                  pcVar3 = "(green_future_done(f)) != (0)";
                                  uStack_30 = 0x32;
                                }
                                else {
                                  p = (void *)0x0;
                                  local_24 = 0;
                                  iVar1 = green_future_result(pgVar2,&p,(int *)0x0);
                                  if (iVar1 == 0) {
                                    if ((int *)p == &local_24) {
                                      if (local_24 == 0) {
                                        p = (void *)0x0;
                                        iVar1 = green_future_result(pgVar2,(void **)0x0,&local_24);
                                        if (iVar1 == 0) {
                                          if (p == (void *)0x0) {
                                            if (local_24 == 7) {
                                              iVar1 = green_future_set_result(pgVar2,&local_24,7);
                                              if (iVar1 == 8) {
                                                iVar1 = green_future_release(pgVar2);
                                                if (iVar1 == 0) {
                                                  pgVar2 = green_future_init(loop);
                                                  if (pgVar2 == (green_future_t)0x0) {
                                                    pcVar3 = "(f) != (((void*)0))";
                                                    uStack_30 = 0x48;
                                                  }
                                                  else {
                                                    iVar1 = green_future_cancel((green_future_t)0x0)
                                                    ;
                                                    if (iVar1 == 1) {
                                                      p = (void *)0x0;
                                                      local_24 = 0;
                                                      iVar1 = green_future_cancel(pgVar2);
                                                      if (iVar1 == 0) {
                                                        iVar1 = green_future_result(pgVar2,&p,
                                                                                    &local_24);
                                                        if (iVar1 == 8) {
                                                          iVar1 = green_future_done(pgVar2);
                                                          if (iVar1 == 0) {
                                                            pcVar3 = "(green_future_done(f)) != (0)"
                                                            ;
                                                            uStack_30 = 0x52;
                                                          }
                                                          else if (p == (void *)0x0) {
                                                            if (local_24 == 0) {
                                                              iVar1 = green_future_cancel(pgVar2);
                                                              if (iVar1 == 8) {
                                                                iVar1 = green_future_set_result
                                                                                  (pgVar2,(void *)
                                                  0x0,0);
                                                  if (iVar1 == 4) {
                                                    iVar1 = green_future_done(pgVar2);
                                                    if (iVar1 == 0) {
                                                      pcVar3 = "(green_future_done(f)) != (0)";
                                                      uStack_30 = 0x5d;
                                                    }
                                                    else {
                                                      iVar1 = green_future_release(pgVar2);
                                                      if (iVar1 == 0) {
                                                        return 0;
                                                      }
                                                      pcVar3 = "(green_future_release(f)) == (0)";
                                                      uStack_30 = 0x60;
                                                    }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "(green_future_set_result(f, ((void*)0), 0)) == (4)"
                                                  ;
                                                  uStack_30 = 0x5a;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "(green_future_cancel(f)) == (8)";
                                                    uStack_30 = 0x57;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "(i) == (0)";
                                                    uStack_30 = 0x54;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "(p) == (((void*)0))";
                                                    uStack_30 = 0x53;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "(green_future_result(f, &p, &i)) == (8)";
                                                  uStack_30 = 0x51;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = "(green_future_cancel(f)) == (0)";
                                                    uStack_30 = 0x50;
                                                  }
                                                  }
                                                  else {
                                                    pcVar3 = 
                                                  "(green_future_cancel(((void*)0))) == (1)";
                                                  uStack_30 = 0x4b;
                                                  }
                                                  }
                                                }
                                                else {
                                                  pcVar3 = "(green_future_release(f)) == (0)";
                                                  uStack_30 = 0x46;
                                                }
                                              }
                                              else {
                                                pcVar3 = 
                                                "(green_future_set_result(f, &i, 7)) == (8)";
                                                uStack_30 = 0x43;
                                              }
                                            }
                                            else {
                                              pcVar3 = "(i) == (7)";
                                              uStack_30 = 0x40;
                                            }
                                          }
                                          else {
                                            pcVar3 = "(p) == (((void*)0))";
                                            uStack_30 = 0x3f;
                                          }
                                        }
                                        else {
                                          pcVar3 = "(green_future_result(f, ((void*)0), &i)) == (0)"
                                          ;
                                          uStack_30 = 0x3e;
                                        }
                                      }
                                      else {
                                        pcVar3 = "(i) == (0)";
                                        uStack_30 = 0x39;
                                      }
                                    }
                                    else {
                                      pcVar3 = "(p) == (&i)";
                                      uStack_30 = 0x38;
                                    }
                                  }
                                  else {
                                    pcVar3 = "(green_future_result(f, &p, ((void*)0))) == (0)";
                                    uStack_30 = 0x37;
                                  }
                                }
                              }
                              else {
                                pcVar3 = "(i) == (7)";
                                uStack_30 = 0x2f;
                              }
                            }
                            else {
                              pcVar3 = "(p) == (&i)";
                              uStack_30 = 0x2e;
                            }
                          }
                          else {
                            pcVar3 = "(green_future_result(f, &p, &i)) == (0)";
                            uStack_30 = 0x2d;
                          }
                        }
                        else {
                          pcVar3 = "(green_future_set_result(f, &i, 7)) == (0)";
                          uStack_30 = 0x2c;
                        }
                      }
                      else {
                        pcVar3 = "(green_future_done(f)) == (0)";
                        uStack_30 = 0x29;
                      }
                    }
                  }
                  else {
                    pcVar3 = "(green_future_result(f, &p, &i)) == (3)";
                    uStack_30 = 0x23;
                  }
                }
                else {
                  pcVar3 = "(green_future_release(((void*)0))) == (1)";
                  uStack_30 = 0x20;
                }
              }
              else {
                pcVar3 = "(green_future_acquire(((void*)0))) == (1)";
                uStack_30 = 0x1f;
              }
            }
            else {
              pcVar3 = "(green_future_set_result(((void*)0), p, i)) == (1)";
              uStack_30 = 0x1c;
            }
          }
          else {
            pcVar3 = "(i) == (0)";
            uStack_30 = 0x19;
          }
        }
        else {
          pcVar3 = "(p) == (((void*)0))";
          uStack_30 = 0x18;
        }
      }
      else {
        pcVar3 = "(green_future_result(((void*)0), &p, &i)) == (1)";
        uStack_30 = 0x17;
      }
    }
  }
  else {
    pcVar3 = "(f) == (((void*)0))";
    uStack_30 = 0xd;
  }
  fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-future.c"
          ,uStack_30,pcVar3);
  abort();
}

Assistant:

int test(green_loop_t loop)
{
    green_future_t f = NULL;

    // Poller is required.
    f = green_future_init(NULL);
    check_eq(f, NULL);

    // Common case.
    f = green_future_init(loop);
    check_ne(f, NULL);

    void * p = NULL;
    int i = 0;

    // Future is required.
    check_eq(green_future_result(NULL, &p, &i), GREEN_EINVAL);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Future is required.
    check_eq(green_future_set_result(NULL, p, i), GREEN_EINVAL);

    // Future is required.
    check_eq(green_future_acquire(NULL), GREEN_EINVAL);
    check_eq(green_future_release(NULL), GREEN_EINVAL);

    // Check result before completion is not supported.
    check_eq(green_future_result(f, &p, &i), GREEN_EBUSY);

    // Function is NULL-proof.
    check_ne(green_future_done(NULL), 0);

    // Future is not done until set_result is called.
    check_eq(green_future_done(f), 0);

    // Once complete, we should be able to get the result.
    check_eq(green_future_set_result(f, &i, 7), 0);
    check_eq(green_future_result(f, &p, &i), 0);
    check_eq(p, &i);
    check_eq(i, 7);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, &p, NULL), 0);
    check_eq(p, &i);
    check_eq(i, 0);

    // We can get a sub-set of the result.
    p = NULL;
    i = 0;
    check_eq(green_future_result(f, NULL, &i), 0);
    check_eq(p, NULL);
    check_eq(i, 7);

    // Setting the result again is prohibited.
    check_eq(green_future_set_result(f, &i, 7), GREEN_EBADFD);

    // Let's get us another future.
    check_eq(green_future_release(f), 0); f = NULL;
    f = green_future_init(loop);
    check_ne(f, NULL);

    // Future is required.
    check_eq(green_future_cancel(NULL), GREEN_EINVAL);

    // Once canceled, the future should be done.
    p = NULL;
    i = 0;
    check_eq(green_future_cancel(f), 0);
    check_eq(green_future_result(f, &p, &i), GREEN_EBADFD);
    check_ne(green_future_done(f), 0);
    check_eq(p, NULL);
    check_eq(i, 0);

    // Cannot be canceled twice.
    check_eq(green_future_cancel(f), GREEN_EBADFD);

    // Cannot complete the future after it has been canceled.
    check_eq(green_future_set_result(f, NULL, 0), GREEN_ECANCELED);

    // After set_result, future is done.
    check_ne(green_future_done(f), 0);

    // Done.
    check_eq(green_future_release(f), 0); f = NULL;

    return EXIT_SUCCESS;
}